

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

Cba_Ntk_t * Cba_NtkAlloc(Cba_Man_t *p,int NameId,int nIns,int nOuts,int nObjs,int nFins,int nFons)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  uint uVar3;
  Cba_Ntk_t *pCVar4;
  void **ppvVar5;
  int *piVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  
  pCVar4 = (Cba_Ntk_t *)calloc(1,0x1b0);
  if ((nObjs | nFins | nOuts | nIns | nFons) < 0) {
    __assert_fail("nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                  ,0x212,"Cba_Ntk_t *Cba_NtkAlloc(Cba_Man_t *, int, int, int, int, int, int)");
  }
  uVar2 = (p->vNtks).nSize;
  pCVar4->Id = uVar2;
  uVar3 = (p->vNtks).nCap;
  if (uVar2 == uVar3) {
    if ((int)uVar3 < 0x10) {
      ppvVar5 = (p->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,0x80);
      }
      (p->vNtks).pArray = ppvVar5;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar3 * 2;
      if (iVar9 <= (int)uVar3) goto LAB_0034d6fe;
      ppvVar5 = (p->vNtks).pArray;
      if (ppvVar5 == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(ppvVar5,(ulong)uVar3 << 4);
      }
      (p->vNtks).pArray = ppvVar5;
    }
    (p->vNtks).nCap = iVar9;
  }
LAB_0034d6fe:
  iVar9 = (p->vNtks).nSize;
  (p->vNtks).nSize = iVar9 + 1;
  (p->vNtks).pArray[iVar9] = pCVar4;
  pCVar4->NameId = NameId;
  pCVar4->pDesign = p;
  if ((pCVar4->vInputs).nCap < nIns) {
    piVar6 = (pCVar4->vInputs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)nIns << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)nIns << 2);
    }
    (pCVar4->vInputs).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0034d99f;
    (pCVar4->vInputs).nCap = nIns;
  }
  if ((pCVar4->vOutputs).nCap < nOuts) {
    piVar6 = (pCVar4->vOutputs).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)nOuts << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)nOuts << 2);
    }
    (pCVar4->vOutputs).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0034d99f;
    (pCVar4->vOutputs).nCap = nOuts;
  }
  if ((pCVar4->vObjType).nCap <= nObjs) {
    iVar9 = nObjs + 1;
    pcVar7 = (pCVar4->vObjType).pArray;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)malloc((long)iVar9);
    }
    else {
      pcVar7 = (char *)realloc(pcVar7,(long)iVar9);
    }
    (pCVar4->vObjType).pArray = pcVar7;
    (pCVar4->vObjType).nCap = iVar9;
  }
  uVar2 = (pCVar4->vObjType).nCap;
  if ((pCVar4->vObjType).nSize == uVar2) {
    if ((int)uVar2 < 0x10) {
      pcVar7 = (pCVar4->vObjType).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,0x10);
      }
      (pCVar4->vObjType).pArray = pcVar7;
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar2 * 2;
      if ((int)sVar8 <= (int)uVar2) goto LAB_0034d82b;
      pcVar7 = (pCVar4->vObjType).pArray;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(pcVar7,sVar8);
      }
      (pCVar4->vObjType).pArray = pcVar7;
    }
    (pCVar4->vObjType).nCap = (int)sVar8;
  }
LAB_0034d82b:
  iVar9 = (pCVar4->vObjType).nSize;
  (pCVar4->vObjType).nSize = iVar9 + 1;
  (pCVar4->vObjType).pArray[iVar9] = '\0';
  pVVar1 = &pCVar4->vObjFin0;
  iVar9 = nObjs + 2;
  if ((pCVar4->vObjFin0).nCap < iVar9) {
    piVar6 = (pCVar4->vObjFin0).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)iVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)iVar9 << 2);
    }
    (pCVar4->vObjFin0).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0034d99f;
    pVVar1->nCap = iVar9;
  }
  Vec_IntPush(pVVar1,0);
  Vec_IntPush(pVVar1,1);
  pVVar1 = &pCVar4->vObjFon0;
  if ((pCVar4->vObjFon0).nCap < iVar9) {
    piVar6 = (pCVar4->vObjFon0).pArray;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)iVar9 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)iVar9 << 2);
    }
    (pCVar4->vObjFon0).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0034d99f;
    pVVar1->nCap = iVar9;
  }
  Vec_IntPush(pVVar1,0);
  Vec_IntPush(pVVar1,1);
  if ((pCVar4->vFinFon).nCap <= nFins) {
    piVar6 = (pCVar4->vFinFon).pArray;
    sVar8 = (long)(nFins + 1) << 2;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(sVar8);
    }
    else {
      piVar6 = (int *)realloc(piVar6,sVar8);
    }
    (pCVar4->vFinFon).pArray = piVar6;
    if (piVar6 == (int *)0x0) goto LAB_0034d99f;
    (pCVar4->vFinFon).nCap = nFins + 1;
  }
  Vec_IntPush(&pCVar4->vFinFon,0);
  if ((pCVar4->vFonObj).nCap <= nFons) {
    piVar6 = (pCVar4->vFonObj).pArray;
    sVar8 = (long)(nFons + 1) << 2;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(sVar8);
    }
    else {
      piVar6 = (int *)realloc(piVar6,sVar8);
    }
    (pCVar4->vFonObj).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_0034d99f:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pCVar4->vFonObj).nCap = nFons + 1;
  }
  Vec_IntPush(&pCVar4->vFonObj,0);
  return pCVar4;
}

Assistant:

static inline Cba_Ntk_t *  Cba_NtkAlloc( Cba_Man_t * p, int NameId, int nIns, int nOuts, int nObjs, int nFins, int nFons )
{    
    Cba_Ntk_t * pNew = ABC_CALLOC( Cba_Ntk_t, 1 );
    assert( nIns >= 0 && nOuts >= 0 && nObjs >= 0 && nFins >= 0 && nFons >= 0 );
    pNew->Id      = Vec_PtrSize(&p->vNtks);   Vec_PtrPush( &p->vNtks, pNew );
    pNew->NameId  = NameId;
    pNew->pDesign = p;
    Vec_IntGrow( &pNew->vInputs,  nIns );
    Vec_IntGrow( &pNew->vOutputs, nOuts );
    Vec_StrGrow( &pNew->vObjType, nObjs+1 );  Vec_StrPush( &pNew->vObjType,  (char)CBA_OBJ_NONE );
    Vec_IntGrow( &pNew->vObjFin0, nObjs+2 );  Vec_IntPush( &pNew->vObjFin0,  0 ); Vec_IntPush( &pNew->vObjFin0, 1 );
    Vec_IntGrow( &pNew->vObjFon0, nObjs+2 );  Vec_IntPush( &pNew->vObjFon0,  0 ); Vec_IntPush( &pNew->vObjFon0, 1 );
    Vec_IntGrow( &pNew->vFinFon,  nFins+1 );  Vec_IntPush( &pNew->vFinFon,   0 );
    Vec_IntGrow( &pNew->vFonObj,  nFons+1 );  Vec_IntPush( &pNew->vFonObj,   0 );
    return pNew;
}